

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

bool __thiscall
cmListCommand::HandleGetCommand
          (cmListCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  ulong uVar6;
  uint uVar7;
  string *name;
  long lVar8;
  ulong uVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varArgsExpanded;
  string value;
  string local_1c8;
  ostringstream str;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)pbVar2 - (long)pbVar1) < 0x80) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,"sub-command GET requires at least three arguments.",
               (allocator<char> *)&value);
    cmCommand::SetError(&this->super_cmCommand,(string *)&str);
    std::__cxx11::string::~string((string *)&str);
    bVar3 = false;
  }
  else {
    varArgsExpanded.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    varArgsExpanded.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    varArgsExpanded.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar3 = GetList(this,&varArgsExpanded,pbVar1 + 1);
    name = pbVar2 + -1;
    if (bVar3) {
      if (varArgsExpanded.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          varArgsExpanded.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&str,"GET given empty list",(allocator<char> *)&value);
        cmCommand::SetError(&this->super_cmCommand,(string *)&str);
        std::__cxx11::string::~string((string *)&str);
        bVar3 = false;
      }
      else {
        value._M_dataplus._M_p = (pointer)&value.field_2;
        value._M_string_length = 0;
        value.field_2._M_local_buf[0] = '\0';
        uVar6 = (long)varArgsExpanded.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)varArgsExpanded.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
        uVar9 = 2;
        lVar8 = 0x40;
        while( true ) {
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          bVar3 = ((long)(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U <=
                  uVar9;
          if (bVar3) break;
          iVar4 = atoi(*(char **)((long)&(pbVar1->_M_dataplus)._M_p + lVar8));
          std::__cxx11::string::append((char *)&value);
          uVar7 = (iVar4 >> 0x1f & (uint)uVar6) + iVar4;
          if (((int)uVar7 < 0) || (uVar6 <= uVar7)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
            poVar5 = std::operator<<((ostream *)&str,"index: ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar7);
            poVar5 = std::operator<<(poVar5," out of range (-");
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            poVar5 = std::operator<<(poVar5,", ");
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            std::operator<<(poVar5,")");
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,&local_1c8);
            std::__cxx11::string::~string((string *)&local_1c8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
            goto LAB_001eb799;
          }
          std::__cxx11::string::append((string *)&value);
          uVar9 = uVar9 + 1;
          lVar8 = lVar8 + 0x20;
        }
        cmMakefile::AddDefinition((this->super_cmCommand).Makefile,name,value._M_dataplus._M_p);
LAB_001eb799:
        std::__cxx11::string::~string((string *)&value);
      }
    }
    else {
      bVar3 = true;
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,name,"NOTFOUND");
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&varArgsExpanded);
  }
  return bVar3;
}

Assistant:

bool cmListCommand::HandleGetCommand(std::vector<std::string> const& args)
{
  if (args.size() < 4) {
    this->SetError("sub-command GET requires at least three arguments.");
    return false;
  }

  const std::string& listName = args[1];
  const std::string& variableName = args.back();
  // expand the variable
  std::vector<std::string> varArgsExpanded;
  if (!this->GetList(varArgsExpanded, listName)) {
    this->Makefile->AddDefinition(variableName, "NOTFOUND");
    return true;
  }
  // FIXME: Add policy to make non-existing lists an error like empty lists.
  if (varArgsExpanded.empty()) {
    this->SetError("GET given empty list");
    return false;
  }

  std::string value;
  size_t cc;
  const char* sep = "";
  size_t nitem = varArgsExpanded.size();
  for (cc = 2; cc < args.size() - 1; cc++) {
    int item = atoi(args[cc].c_str());
    value += sep;
    sep = ";";
    if (item < 0) {
      item = static_cast<int>(nitem) + item;
    }
    if (item < 0 || nitem <= static_cast<size_t>(item)) {
      std::ostringstream str;
      str << "index: " << item << " out of range (-" << nitem << ", "
          << nitem - 1 << ")";
      this->SetError(str.str());
      return false;
    }
    value += varArgsExpanded[item];
  }

  this->Makefile->AddDefinition(variableName, value.c_str());
  return true;
}